

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

ON_Extrusion *
ON_Extrusion::Pipe(ON_Cylinder *cylinder,double other_radius,bool bCapBottom,bool bCapTop,
                  ON_Extrusion *extrusion)

{
  bool bVar1;
  int iVar2;
  ON_Extrusion *this;
  ON_Extrusion *this_00;
  _func_int **pp_Var3;
  double dVar4;
  double x;
  ON_Circle inner_circle;
  ON_Cylinder outer_cylinder;
  ON_Circle local_148;
  ON_Cylinder local_c0;
  
  bVar1 = ON_Cylinder::IsValid(cylinder);
  if (((!bVar1) || (bVar1 = ON_IsValid(other_radius), !bVar1)) ||
     (dVar4 = ON_Circle::Radius(&cylinder->circle),
     ABS(other_radius - dVar4) <= 2.3283064365386963e-10)) {
    return (ON_Extrusion *)0x0;
  }
  dVar4 = (cylinder->circle).radius;
  x = other_radius;
  if (dVar4 <= other_radius) {
    x = dVar4;
  }
  bVar1 = ON_IsValid(x);
  if (!bVar1) {
    return (ON_Extrusion *)0x0;
  }
  if (dVar4 <= other_radius) {
    dVar4 = other_radius;
  }
  bVar1 = ON_IsValid(dVar4);
  if (dVar4 - x <= 2.3283064365386963e-10 || !bVar1) {
    return (ON_Extrusion *)0x0;
  }
  memcpy(&local_c0,cylinder,0x98);
  local_c0.circle.radius = dVar4;
  ON_Circle::ON_Circle(&local_148,&ON_Plane::World_xy,x);
  this = (ON_Extrusion *)operator_new(0xc0);
  ON_ArcCurve::ON_ArcCurve((ON_ArcCurve *)this,&local_148);
  *(undefined4 *)((this->m_path_domain).m_t + 1) = 2;
  iVar2 = (*(((ON_Curve *)&this->super_ON_Surface)->super_ON_Geometry).super_ON_Object.
            _vptr_ON_Object[6])(this,0);
  if (((char)iVar2 == '\0') ||
     (this_00 = Cylinder(&local_c0,bCapBottom,bCapTop,extrusion), this_00 == (ON_Extrusion *)0x0)) {
LAB_003f8191:
    pp_Var3 = (((ON_Curve *)&this->super_ON_Surface)->super_ON_Geometry).super_ON_Object.
              _vptr_ON_Object;
LAB_003f8197:
    (*pp_Var3[4])(this);
  }
  else {
    iVar2 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                      (this_00,0);
    if (((char)iVar2 == '\0') || (bVar1 = AddInnerProfile(this_00,(ON_Curve *)this), !bVar1)) {
      if (extrusion == (ON_Extrusion *)0x0) {
        (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00)
        ;
      }
      goto LAB_003f8191;
    }
    iVar2 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                      (this_00,0);
    if ((char)iVar2 != '\0') goto LAB_003f819d;
    if (extrusion == (ON_Extrusion *)0x0) {
      pp_Var3 = (this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
      this = this_00;
      goto LAB_003f8197;
    }
  }
  this_00 = (ON_Extrusion *)0x0;
LAB_003f819d:
  ON_Plane::~ON_Plane(&local_148.plane);
  ON_Cylinder::~ON_Cylinder(&local_c0);
  return this_00;
}

Assistant:

ON_Extrusion* ON_Extrusion::Pipe( 
  const ON_Cylinder& cylinder, 
  double other_radius,
  bool bCapBottom,
  bool bCapTop,
  ON_Extrusion* extrusion
  )
{
  if (    !cylinder.IsValid() 
       || !ON_IsValid(other_radius)
       || !(fabs(other_radius - cylinder.circle.Radius()) > ON_ZERO_TOLERANCE)
       )
  {
    return 0;
  }

  double inner_radius = (other_radius < cylinder.circle.radius)
                      ? other_radius
                      : cylinder.circle.radius;
  double outer_radius = (other_radius < cylinder.circle.radius)
                      ? cylinder.circle.radius
                      : other_radius;
  if (    !ON_IsValid(inner_radius) 
       || !ON_IsValid(outer_radius)
       || !(outer_radius - inner_radius > ON_ZERO_TOLERANCE)
     )
  {
    return 0;
  }

  ON_Cylinder outer_cylinder = cylinder;
  outer_cylinder.circle.radius = outer_radius;

  ON_Circle inner_circle(ON_Plane::World_xy,inner_radius);
  ON_ArcCurve* inner_profile = new ON_ArcCurve(inner_circle);
  inner_profile->m_dim = 2;
  if ( !inner_profile->IsValid() )
  {
    delete inner_profile;
    return 0;
  }

  ON_Extrusion* extrusion_pipe = ON_Extrusion::Cylinder(outer_cylinder,bCapBottom,bCapTop,extrusion);
  if ( 0 == extrusion_pipe )
  {
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->AddInnerProfile(inner_profile) )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    return 0;
  }

  return extrusion_pipe;
}